

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

void __thiscall embree::Scene::Scene(Scene *this,Device *device)

{
  _Rb_tree_header *p_Var1;
  RTCBuildQuality RVar2;
  RTCSceneFlags RVar3;
  TaskGroup *__s;
  
  AccelN::AccelN(&this->super_AccelN);
  (this->super_AccelN).super_Accel.super_AccelData.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Scene_02202780;
  *(Device **)&(this->super_AccelN).field_0x188 = device;
  this->scene_device = (Scene *)0x0;
  p_Var1 = &(this->id_pool).IDs._M_t._M_impl.super__Rb_tree_header;
  (this->id_pool).IDs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->id_pool).IDs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->id_pool).IDs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->id_pool).IDs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->id_pool).IDs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->id_pool).nextID = 0;
  (this->geometries).alloc.device = device;
  (this->geometries).size_active = 0;
  (this->geometries).size_alloced = 0;
  (this->geometries).items = (Ref<embree::Geometry> *)0x0;
  (this->geometryModCounters_).size_active = 0;
  (this->geometryModCounters_).size_alloced = 0;
  (this->geometryModCounters_).items = (uint *)0x0;
  (this->vertices).alloc.device = device;
  (this->vertices).size_active = 0;
  (this->vertices).size_alloced = 0;
  (this->vertices).items = (float **)0x0;
  this->flags_modified = true;
  this->enabled_geometry_types = 0;
  this->scene_flags = RTC_SCENE_FLAG_NONE;
  this->quality_flags = RTC_BUILD_QUALITY_MEDIUM;
  MutexSys::MutexSys(&this->buildMutex);
  MutexSys::MutexSys(&this->geometriesMutex);
  this->modified = true;
  this->maxTimeSegments = 0;
  __s = (TaskGroup *)operator_new(0x90);
  memset(__s,0,0x90);
  *(undefined8 *)&(__s->group).super_task_group = 1;
  (__s->group).super_task_group.super_task_group_base.m_wait_ctx.m_ref_count.
  super___atomic_base<unsigned_long>._M_i = 0;
  (__s->group).super_task_group.super_task_group_base.m_context.my_version = proxy_support;
  (__s->group).super_task_group.super_task_group_base.m_context.my_traits = (context_traits)0x6;
  (__s->group).super_task_group.super_task_group_base.m_context.my_node.my_prev_node =
       (intrusive_list_node *)0x0;
  (__s->group).super_task_group.super_task_group_base.m_context.my_node.my_next_node =
       (intrusive_list_node *)0x0;
  (__s->group).super_task_group.super_task_group_base.m_context.my_name = CUSTOM_CTX;
  tbb::detail::r1::initialize(&(__s->group).super_task_group.super_task_group_base.m_context);
  (this->taskGroup)._M_t.
  super___uniq_ptr_impl<embree::TaskGroup,_std::default_delete<embree::TaskGroup>_>._M_t.
  super__Tuple_impl<0UL,_embree::TaskGroup_*,_std::default_delete<embree::TaskGroup>_>.
  super__Head_base<0UL,_embree::TaskGroup_*,_false>._M_head_impl = __s;
  (this->progressInterface).super_BuildProgressMonitor._vptr_BuildProgressMonitor =
       (_func_int **)&PTR_operator___02202970;
  (this->progressInterface).scene = this;
  memset(&this->progress_monitor_function,0,0xe0);
  (*(device->super_State).super_RefCount._vptr_RefCount[2])(device);
  *(undefined8 *)&(this->super_AccelN).super_Accel.super_AccelData.field_0x58 = 0;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0x60 = 0;
  *(code **)&(this->super_AccelN).super_Accel.field_0x68 = missing_rtcCommit;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0x70 = 0;
  *(code **)&(this->super_AccelN).super_Accel.field_0x78 = missing_rtcCommit;
  *(code **)&(this->super_AccelN).super_Accel.field_0x80 = missing_rtcCommit;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0x90 = 0;
  *(code **)&(this->super_AccelN).super_Accel.field_0x98 = missing_rtcCommit;
  *(code **)&(this->super_AccelN).super_Accel.field_0xa0 = missing_rtcCommit;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0xa8 = 0;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0xb0 = 0;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0xb8 = 0;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0xc0 = 0;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0xc8 = 0;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0xd0 = 0;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0xd8 = 0;
  *(code **)&(this->super_AccelN).super_Accel.field_0xe0 = missing_rtcCommit;
  *(code **)&(this->super_AccelN).super_Accel.field_0xe8 = missing_rtcCommit;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0xf0 = 0;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0xf8 = 0;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0x100 = 0;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0x108 = 0;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0x110 = 0;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0x118 = 0;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0x120 = 0;
  *(code **)&(this->super_AccelN).super_Accel.field_0x128 = missing_rtcCommit;
  *(code **)&(this->super_AccelN).super_Accel.field_0x130 = missing_rtcCommit;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0x138 = 0;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0x140 = 0;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0x148 = 0;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0x150 = 0;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0x158 = 0;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0x160 = 0;
  *(undefined8 *)&(this->super_AccelN).super_Accel.field_0x168 = 0;
  RVar2 = (device->super_State).quality_flags;
  if (RVar2 != ~RTC_BUILD_QUALITY_LOW) {
    this->quality_flags = RVar2;
  }
  RVar3 = (device->super_State).scene_flags;
  if (RVar3 != ~RTC_SCENE_FLAG_NONE) {
    this->scene_flags = RVar3;
  }
  return;
}

Assistant:

Scene::Scene (Device* device)
    : device(device),
      scene_device(nullptr),
      flags_modified(true), enabled_geometry_types(0),
      scene_flags(RTC_SCENE_FLAG_NONE),
      quality_flags(RTC_BUILD_QUALITY_MEDIUM),
      modified(true),
      maxTimeSegments(0),
#if defined(EMBREE_SYCL_SUPPORT)
      geometries_device(nullptr),
      geometry_data_device(nullptr),
      num_geometries(0),
      geometry_data_byte_size(0),
      offsets(nullptr),
      geometries_host(nullptr),
      geometry_data_host(nullptr),
#endif
      taskGroup(new TaskGroup()),
      progressInterface(this), progress_monitor_function(nullptr), progress_monitor_ptr(nullptr), progress_monitor_counter(0)
  {
    device->refInc();

    intersectors = Accel::Intersectors(missing_rtcCommit);

    /* use proper device and context for SYCL allocations */
#if defined(EMBREE_SYCL_SUPPORT)
    if (dynamic_cast<DeviceGPU*>(device))
      accelBuffer = AccelBuffer(device);
#endif
       
    /* one can overwrite flags through device for debugging */
    if (device->quality_flags != -1)
      quality_flags = (RTCBuildQuality) device->quality_flags;
    if (device->scene_flags != -1)
      scene_flags = (RTCSceneFlags) device->scene_flags;
  }